

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::handleAttributesPSVI
          (AbstractDOMParser *this,XMLCh *localName,XMLCh *uri,PSVIAttributeList *psviAttributes)

{
  DOMDocumentImpl *pDVar1;
  PSVIHandler *pPVar2;
  byte bVar3;
  int iVar4;
  XMLSize_t XVar5;
  PSVIAttribute *pPVar6;
  undefined4 extraout_var;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  long *plVar9;
  DOMTypeInfoImpl *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  DOMDocument *doc;
  XMLSize_t index;
  ulong index_00;
  
  if (this->fCreateSchemaInfo == true) {
    index_00 = 0;
    while( true ) {
      XVar5 = PSVIAttributeList::getLength(psviAttributes);
      if (XVar5 <= index_00) break;
      pPVar6 = PSVIAttributeList::getAttributePSVIAtIndex(psviAttributes,index_00);
      iVar4 = (*this->fCurrentNode->_vptr_DOMNode[0xb])();
      pXVar7 = PSVIAttributeList::getAttributeNamespaceAtIndex(psviAttributes,index_00);
      pXVar8 = PSVIAttributeList::getAttributeNameAtIndex(psviAttributes,index_00);
      plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x38))
                                 ((long *)CONCAT44(extraout_var,iVar4),pXVar7,pXVar8);
      if (plVar9 != (long *)0x0) {
        doc = &this->fDocument->super_DOMDocument;
        if (this->fDocument == (DOMDocumentImpl *)0x0) {
          doc = (DOMDocument *)0x0;
        }
        this_00 = (DOMTypeInfoImpl *)operator_new(0x48,doc);
        DOMTypeInfoImpl::DOMTypeInfoImpl(this_00,(XMLCh *)0x0,(XMLCh *)0x0);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])
                  (this_00,0,(ulong)(pPVar6->super_PSVIItem).fValidityState);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])
                  (this_00,1,(ulong)(pPVar6->super_PSVIItem).fAssessmentType);
        iVar4 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[2])(pPVar6);
        if (CONCAT44(extraout_var_00,iVar4) == 0) {
          if ((pPVar6->super_PSVIItem).fValidityState == VALIDITY_VALID) {
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,2,0x10);
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,0);
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                      (this_00,4,SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                      (this_00,3,SchemaSymbols::fgDT_ANYSIMPLETYPE);
          }
        }
        else {
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,2,0x10);
          iVar4 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[2])(pPVar6);
          bVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x38))
                            ((long *)CONCAT44(extraout_var_01,iVar4));
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,(ulong)bVar3);
          pDVar1 = this->fDocument;
          iVar4 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[2])(pPVar6);
          pXVar7 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x18))
                                      ((long *)CONCAT44(extraout_var_02,iVar4));
          pXVar7 = DOMDocumentImpl::getPooledString(pDVar1,pXVar7);
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,4,pXVar7);
          pDVar1 = this->fDocument;
          iVar4 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[2])(pPVar6);
          pXVar7 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x10))
                                      ((long *)CONCAT44(extraout_var_03,iVar4));
          pXVar7 = DOMDocumentImpl::getPooledString(pDVar1,pXVar7);
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,3,pXVar7);
        }
        iVar4 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[3])(pPVar6);
        if (CONCAT44(extraout_var_04,iVar4) != 0) {
          iVar4 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[3])(pPVar6);
          bVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x38))
                            ((long *)CONCAT44(extraout_var_05,iVar4));
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,9,(ulong)bVar3);
          pDVar1 = this->fDocument;
          iVar4 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[3])(pPVar6);
          pXVar7 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x18))
                                      ((long *)CONCAT44(extraout_var_06,iVar4));
          pXVar7 = DOMDocumentImpl::getPooledString(pDVar1,pXVar7);
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,8,pXVar7);
          pDVar1 = this->fDocument;
          iVar4 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[3])(pPVar6);
          pXVar7 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x10))
                                      ((long *)CONCAT44(extraout_var_07,iVar4));
          pXVar7 = DOMDocumentImpl::getPooledString(pDVar1,pXVar7);
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,7,pXVar7);
        }
        pXVar7 = DOMDocumentImpl::getPooledString
                           (this->fDocument,(pPVar6->super_PSVIItem).fDefaultValue);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,10,pXVar7);
        pXVar7 = DOMDocumentImpl::getPooledString
                           (this->fDocument,(pPVar6->super_PSVIItem).fNormalizedValue);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,0xb,pXVar7);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,0xc,1);
        (**(code **)(*plVar9 + 0x1a8))(plVar9,this_00);
      }
      index_00 = index_00 + 1;
    }
  }
  pPVar2 = this->fPSVIHandler;
  if (pPVar2 != (PSVIHandler *)0x0) {
    (*pPVar2->_vptr_PSVIHandler[4])(pPVar2,localName,uri,psviAttributes);
    return;
  }
  return;
}

Assistant:

void AbstractDOMParser::handleAttributesPSVI( const XMLCh* const            localName
                                            , const XMLCh* const            uri
                                            ,       PSVIAttributeList *     psviAttributes)
{
    if(fCreateSchemaInfo)
    {
        for (XMLSize_t index=0; index < psviAttributes->getLength(); index++) {
            xercesc::PSVIAttribute *attrInfo=psviAttributes->getAttributePSVIAtIndex(index);
            xercesc::DOMNode* pAttrNode=fCurrentNode->getAttributes()->getNamedItemNS(psviAttributes->getAttributeNamespaceAtIndex(index),
                                                                                                            psviAttributes->getAttributeNameAtIndex(index));
            if(pAttrNode!=NULL)
            {
                DOMTypeInfoImpl* typeInfo=new (getDocument()) DOMTypeInfoImpl();
                typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validity, attrInfo->getValidity());
                typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validation_Attempted, attrInfo->getValidationAttempted());
                if(attrInfo->getTypeDefinition())
                {
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, XSTypeDefinition::SIMPLE_TYPE);
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, attrInfo->getTypeDefinition()->getAnonymous());
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace,
                        fDocument->getPooledString(attrInfo->getTypeDefinition()->getNamespace()));
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name,
                        fDocument->getPooledString(attrInfo->getTypeDefinition()->getName()));
                }
                else if(attrInfo->getValidity()==PSVIItem::VALIDITY_VALID)
                {
                    // if we are valid but we don't have a type validator, we are xs:anySimpleType
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, XSTypeDefinition::SIMPLE_TYPE);
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, false);
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name, SchemaSymbols::fgDT_ANYSIMPLETYPE);
                }
                if(attrInfo->getMemberTypeDefinition())
                {
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Anonymous, attrInfo->getMemberTypeDefinition()->getAnonymous());
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Namespace,
                        fDocument->getPooledString(attrInfo->getMemberTypeDefinition()->getNamespace()));
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Name,
                        fDocument->getPooledString(attrInfo->getMemberTypeDefinition()->getName()));
                }
                typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Default, fDocument->getPooledString(attrInfo->getSchemaDefault()));
                typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Normalized_Value, fDocument->getPooledString(attrInfo->getSchemaNormalizedValue()));
                typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Schema_Specified, true);
                ((DOMAttrImpl*)pAttrNode)->setSchemaTypeInfo(typeInfo);
            }
        }
    }
    // associate the info now; if the user wants, she can override what we did
    if(fPSVIHandler)
        fPSVIHandler->handleAttributesPSVI(localName, uri, psviAttributes);
}